

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O0

string * __thiscall
iutest::internal::FormatForComparisonFailureMessage<iutest::TestEnv::RepeatCountSet,int>
          (string *__return_storage_ptr__,internal *this,RepeatCountSet *value,int *param_2)

{
  int *param_1_local;
  RepeatCountSet *value_local;
  
  PrintToString<iutest::TestEnv::RepeatCountSet>(__return_storage_ptr__,(RepeatCountSet *)this);
  return __return_storage_ptr__;
}

Assistant:

inline ::std::string FormatForComparisonFailureMessage(const T1& value, const T2& /*other_operand*/)
{
    return PrintToString(value);
}